

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O2

int32_t u_parseUTF8(char *source,int32_t sLen,char *dest,int32_t destCapacity,UErrorCode *status)

{
  int32_t iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  uint value;
  undefined4 local_48;
  int32_t local_44;
  char *local_40;
  UErrorCode *local_38;
  
  local_48 = 0;
  local_40 = dest;
  local_38 = status;
  if (sLen == -1) {
    sVar2 = strlen(source);
    sLen = (int32_t)sVar2;
  }
  pcVar3 = source + sLen;
  lVar4 = 0;
  local_44 = destCapacity;
  for (; source < pcVar3; source = source + 2) {
    __isoc99_sscanf(source,"%2x",&local_48);
    if (lVar4 < destCapacity) {
      local_40[lVar4] = (char)local_48;
    }
    lVar4 = lVar4 + 1;
  }
  iVar1 = u_terminateChars_63(local_40,local_44,(int32_t)lVar4,local_38);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseUTF8(const char *source, int32_t sLen, char *dest, int32_t destCapacity, UErrorCode *status) {
    const char *read = source;
    int32_t i = 0;
    unsigned int value = 0;
    if(sLen == -1) {
        sLen = (int32_t)strlen(source);
    }
    
    while(read < source+sLen) {
        sscanf(read, "%2x", &value);
        if(i < destCapacity) {
            dest[i] = (char)value;
        }
        i++;
        read += 2;
    }
    return u_terminateChars(dest, destCapacity, i, status);
}